

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeSearchPointSwap(RtreeCursor *p,int i,int j)

{
  RtreeSearchPoint *pRVar1;
  RtreeNode *pRVar2;
  RtreeDValue RVar3;
  sqlite3_int64 sVar4;
  sqlite3_int64 sVar5;
  RtreeSearchPoint *pRVar6;
  u8 uVar7;
  u8 uVar8;
  undefined5 uVar9;
  u8 uVar10;
  u8 uVar11;
  u8 uVar12;
  undefined5 uVar13;
  int iVar14;
  RtreeSearchPoint t;
  
  pRVar1 = p->aPoint;
  pRVar6 = pRVar1 + i;
  uVar10 = pRVar6->iLevel;
  uVar11 = pRVar6->eWithin;
  uVar12 = pRVar6->iCell;
  uVar13 = *(undefined5 *)&pRVar6->field_0x13;
  RVar3 = pRVar1[i].rScore;
  sVar4 = pRVar1[i].id;
  sVar5 = pRVar1[j].id;
  pRVar1[i].rScore = pRVar1[j].rScore;
  pRVar1[i].id = sVar5;
  pRVar6 = pRVar1 + j;
  uVar7 = pRVar6->eWithin;
  uVar8 = pRVar6->iCell;
  uVar9 = *(undefined5 *)&pRVar6->field_0x13;
  pRVar1 = pRVar1 + i;
  pRVar1->iLevel = pRVar6->iLevel;
  pRVar1->eWithin = uVar7;
  pRVar1->iCell = uVar8;
  *(undefined5 *)&pRVar1->field_0x13 = uVar9;
  pRVar1 = p->aPoint;
  pRVar6 = pRVar1 + j;
  pRVar6->iLevel = uVar10;
  pRVar6->eWithin = uVar11;
  pRVar6->iCell = uVar12;
  *(undefined5 *)&pRVar6->field_0x13 = uVar13;
  pRVar1 = pRVar1 + j;
  pRVar1->rScore = RVar3;
  pRVar1->id = sVar4;
  if (i < 4) {
    iVar14 = i + 1;
    if (j < 4) {
      pRVar2 = p->aNode[iVar14];
      p->aNode[iVar14] = p->aNode[j + 1];
      p->aNode[j + 1] = pRVar2;
    }
    else {
      nodeRelease((Rtree *)(p->base).pVtab,p->aNode[iVar14]);
      p->aNode[iVar14] = (RtreeNode *)0x0;
    }
  }
  return;
}

Assistant:

static void rtreeSearchPointSwap(RtreeCursor *p, int i, int j){
  RtreeSearchPoint t = p->aPoint[i];
  assert( i<j );
  p->aPoint[i] = p->aPoint[j];
  p->aPoint[j] = t;
  i++; j++;
  if( i<RTREE_CACHE_SZ ){
    if( j>=RTREE_CACHE_SZ ){
      nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
      p->aNode[i] = 0;
    }else{
      RtreeNode *pTemp = p->aNode[i];
      p->aNode[i] = p->aNode[j];
      p->aNode[j] = pTemp;
    }
  }
}